

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

int MemHashGrowTable(mem_hash_kv_engine *pEngine)

{
  uint uVar1;
  uint uVar2;
  mem_hash_record *pmVar3;
  uint uVar4;
  mem_hash_record **ppmVar5;
  mem_hash_record **ppmVar6;
  mem_hash_record **ppmVar7;
  uint uVar8;
  uint uVar9;
  
  uVar2 = pEngine->nBucket;
  ppmVar5 = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc,uVar2 << 4);
  ppmVar7 = ppmVar5;
  if (ppmVar5 != (mem_hash_record **)0x0) {
    if ((uVar2 & 0xfffffff) != 0) {
      ppmVar6 = (mem_hash_record **)((long)ppmVar5 + (ulong)(uVar2 << 4));
      do {
        *(undefined1 *)ppmVar7 = 0;
        if (ppmVar6 <= (mem_hash_record **)((long)ppmVar7 + 1)) break;
        *(undefined1 *)((long)ppmVar7 + 1) = 0;
        if (ppmVar6 <= (mem_hash_record **)((long)ppmVar7 + 2)) break;
        *(undefined1 *)((long)ppmVar7 + 2) = 0;
        if (ppmVar6 <= (mem_hash_record **)((long)ppmVar7 + 3)) break;
        *(undefined1 *)((long)ppmVar7 + 3) = 0;
        ppmVar7 = (mem_hash_record **)((long)ppmVar7 + 4);
      } while (ppmVar7 < ppmVar6);
    }
    uVar4 = pEngine->nRecord;
    if (uVar4 != 0) {
      ppmVar7 = &pEngine->pLast;
      uVar1 = uVar2 * 2 - 1;
      uVar8 = 0;
      do {
        pmVar3 = *ppmVar7;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar9 = pmVar3->nHash & uVar1;
        pmVar3->pNextHash = ppmVar5[uVar9];
        if (ppmVar5[uVar9] != (mem_hash_record *)0x0) {
          ppmVar5[uVar9]->pPrevHash = pmVar3;
        }
        ppmVar5[uVar9] = pmVar3;
        if (uVar4 <= uVar8 + 1) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar9 = pmVar3->nHash & uVar1;
        pmVar3->pNextHash = ppmVar5[uVar9];
        if (ppmVar5[uVar9] != (mem_hash_record *)0x0) {
          ppmVar5[uVar9]->pPrevHash = pmVar3;
        }
        ppmVar5[uVar9] = pmVar3;
        if (uVar4 <= uVar8 + 2) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar9 = pmVar3->nHash & uVar1;
        pmVar3->pNextHash = ppmVar5[uVar9];
        if (ppmVar5[uVar9] != (mem_hash_record *)0x0) {
          ppmVar5[uVar9]->pPrevHash = pmVar3;
        }
        ppmVar5[uVar9] = pmVar3;
        if (uVar4 <= uVar8 + 3) break;
        pmVar3 = pmVar3->pNext;
        pmVar3->pNextHash = (mem_hash_record *)0x0;
        pmVar3->pPrevHash = (mem_hash_record *)0x0;
        uVar9 = pmVar3->nHash & uVar1;
        pmVar3->pNextHash = ppmVar5[uVar9];
        if (ppmVar5[uVar9] != (mem_hash_record *)0x0) {
          ppmVar5[uVar9]->pPrevHash = pmVar3;
        }
        ppmVar5[uVar9] = pmVar3;
        ppmVar7 = &pmVar3->pNext;
        uVar8 = uVar8 + 4;
      } while (uVar8 < uVar4);
    }
    uVar4 = SyMemBackendFree(&pEngine->sAlloc,pEngine->apBucket);
    ppmVar7 = (mem_hash_record **)(ulong)uVar4;
    pEngine->apBucket = ppmVar5;
    pEngine->nBucket = uVar2 * 2;
  }
  return (int)ppmVar7;
}

Assistant:

static int MemHashGrowTable(mem_hash_kv_engine *pEngine)
{
	sxu32 nNewSize = pEngine->nBucket << 1;
	mem_hash_record *pEntry;
	mem_hash_record **apNew;
	sxu32 n,iBucket;
	/* Allocate a new larger table */
	apNew = (mem_hash_record **)SyMemBackendAlloc(&pEngine->sAlloc, nNewSize * sizeof(mem_hash_record *));
	if( apNew == 0 ){
		/* Not so fatal, simply a performance hit */
		return UNQLITE_OK;
	}
	/* Zero the new table */
	SyZero((void *)apNew, nNewSize * sizeof(mem_hash_record *));
	/* Rehash all entries */
	n = 0;
	pEntry = pEngine->pLast;
	for(;;){
		
		/* Loop one */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop two */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop three */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;

		/* Loop four */
		if( n >= pEngine->nRecord ){
			break;
		}
		pEntry->pNextHash = pEntry->pPrevHash = 0;
		/* Install in the new bucket */
		iBucket = pEntry->nHash & (nNewSize - 1);
		pEntry->pNextHash = apNew[iBucket];
		if( apNew[iBucket] ){
			apNew[iBucket]->pPrevHash = pEntry;
		}
		apNew[iBucket] = pEntry;
		/* Point to the next entry */
		pEntry = pEntry->pNext;
		n++;
	}
	/* Release the old table and reflect the change */
	SyMemBackendFree(&pEngine->sAlloc,(void *)pEngine->apBucket);
	pEngine->apBucket = apNew;
	pEngine->nBucket  = nNewSize;
	return UNQLITE_OK;
}